

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O2

bool __thiscall ConditionalExecution::verifySameCondition(ConditionalExecution *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ConditionMarker tester;
  ConditionMarker local_80;
  PcodeOp *initop;
  
  iVar2 = (*(this->initblock->super_FlowBlock)._vptr_FlowBlock[0xe])();
  initop = (PcodeOp *)CONCAT44(extraout_var,iVar2);
  if ((initop == (PcodeOp *)0x0) || (initop->opcode->opcode != CPUI_CBRANCH)) {
    bVar1 = false;
  }
  else {
    ConditionMarker::ConditionMarker(&local_80);
    bVar1 = ConditionMarker::verifyCondition(&local_80,this->cbranch,initop);
    if (bVar1) {
      if (local_80.matchflip == true) {
        this->init2a_true = (bool)(this->init2a_true ^ 1);
      }
      if (local_80.multislot != -1) {
        this->directsplit = true;
        this->posta_outslot = (uint)(local_80.multislot != this->prea_inslot);
        if (this->init2a_true == true) {
          this->posta_outslot = (uint)(local_80.multislot == this->prea_inslot);
        }
      }
    }
    ConditionMarker::~ConditionMarker(&local_80);
  }
  return bVar1;
}

Assistant:

bool ConditionalExecution::verifySameCondition(void)

{
  PcodeOp *init_cbranch = initblock->lastOp();
  if (init_cbranch == (PcodeOp *)0) return false;
  if (init_cbranch->code() != CPUI_CBRANCH) return false;

  ConditionMarker tester;
  if (!tester.verifyCondition(cbranch,init_cbranch))
    return false;

  if (tester.getFlip())
    init2a_true = !init2a_true;
  int4 multislot = tester.getMultiSlot();
  if (multislot != -1) {
    // This is a direct split
    directsplit = true;
    posta_outslot = (multislot == prea_inslot) ? 0 : 1;
    if (init2a_true)
      posta_outslot = 1 - posta_outslot;
  }
  return true;
}